

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O1

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::DumpByteCode
          (JsBuiltInEngineInterfaceExtensionObject *this,JsBuiltInFile_conflict file)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *message;
  char *error;
  Type *pTVar4;
  
  Output::Print(L"Dumping JS Built Ins Byte Code:\n");
  if (file == Object_constructor) {
    pTVar4 = &this->jsBuiltInObject_constructorBytecode;
    if ((this->jsBuiltInObject_constructorBytecode).ptr != (FunctionBody *)0x0) goto LAB_00d3c42a;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    error = "(this->jsBuiltInObject_constructorBytecode != nullptr)";
    message = "this->jsBuiltInObject_constructorBytecode != nullptr";
  }
  else if (file == Math_object) {
    pTVar4 = &this->jsBuiltInMath_objectBytecode;
    if ((this->jsBuiltInMath_objectBytecode).ptr != (FunctionBody *)0x0) goto LAB_00d3c42a;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    error = "(this->jsBuiltInMath_objectBytecode != nullptr)";
    message = "this->jsBuiltInMath_objectBytecode != nullptr";
  }
  else {
    if (file != Array_prototype) {
      return;
    }
    pTVar4 = &this->jsBuiltInArray_prototypeBytecode;
    if ((this->jsBuiltInArray_prototypeBytecode).ptr != (FunctionBody *)0x0) goto LAB_00d3c42a;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    error = "(this->jsBuiltInArray_prototypeBytecode != nullptr)";
    message = "this->jsBuiltInArray_prototypeBytecode != nullptr";
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                              ,0xdb,error,message);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00d3c42a:
  ByteCodeDumper::DumpRecursively(pTVar4->ptr);
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::DumpByteCode(JsBuiltInFile file)
    {
        Output::Print(_u("Dumping JS Built Ins Byte Code:\n"));
        switch (file)
        {
            #define fileCase(class, type, obj) \
            case class##_##type: \
                Assert(this->jsBuiltIn##class##_##type##Bytecode != nullptr); \
                Js::ByteCodeDumper::DumpRecursively(this->jsBuiltIn##class##_##type##Bytecode); \
                break;
            JsBuiltIns(fileCase)
            #undef fileCase
        }
    }